

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestEnumMapPlusExtraLite::~TestEnumMapPlusExtraLite(TestEnumMapPlusExtraLite *this)

{
  ~TestEnumMapPlusExtraLite(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TestEnumMapPlusExtraLite::~TestEnumMapPlusExtraLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestEnumMapPlusExtraLite)
  SharedDtor(*this);
}